

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

void ApplicativeHelper::getHeadAndAllArgs(TermList term,TermList *head,TermStack *args)

{
  bool bVar1;
  TermList *pTVar2;
  Term *pTVar3;
  uint64_t in_RDX;
  uint64_t *in_RSI;
  uint64_t in_RDI;
  int i;
  uint arity;
  Stack<Kernel::TermList> *in_stack_ffffffffffffffb8;
  TermList in_stack_ffffffffffffffc0;
  TermList elem;
  uint local_28;
  uint64_t local_8;
  
  local_8 = in_RDI;
  while (bVar1 = Kernel::TermList::isApplication((TermList *)in_stack_ffffffffffffffc0._content),
        bVar1) {
    pTVar3 = Kernel::TermList::term((TermList *)0x840f77);
    Kernel::Term::nthArgument(pTVar3,3);
    Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
    pTVar3 = Kernel::TermList::term((TermList *)0x840fa5);
    pTVar2 = Kernel::Term::nthArgument(pTVar3,2);
    local_8 = pTVar2->_content;
  }
  *in_RSI = local_8;
  bVar1 = Kernel::TermList::isTerm((TermList *)0x840fd3);
  if (bVar1) {
    pTVar3 = Kernel::TermList::term((TermList *)0x840fe3);
    local_28 = Kernel::Term::arity(pTVar3);
    while (local_28 = local_28 - 1, -1 < (int)local_28) {
      elem._content = in_RDX;
      pTVar3 = Kernel::TermList::term((TermList *)0x841015);
      Kernel::Term::nthArgument(pTVar3,local_28);
      Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffffb8,elem);
    }
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndAllArgs(TermList term, TermList& head, TermStack& args)
{
  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;  
  if(term.isTerm()){
    unsigned arity = term.term()->arity();
    for(int i = arity-1; i >= 0; i--){
      args.push(*term.term()->nthArgument(i));
    }
  }
}